

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundFMOD.cpp
# Opt level: O1

void __thiscall XPMP2::SoundSystemFMOD::SetAllMute(SoundSystemFMOD *this,bool bMute)

{
  FMOD_RESULT _r;
  undefined7 in_register_00000031;
  string local_e0;
  string local_c0;
  string local_a0;
  undefined **local_80 [3];
  _Alloc_hider local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  _Alloc_hider local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  gFmodRes = FMOD_ChannelGroup_SetMute(this->pChnGrp,CONCAT71(in_register_00000031,bMute));
  if (gFmodRes != FMOD_OK) {
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a0,"FMOD_ChannelGroup_SetMute(pChnGrp, bMute)","");
    _r = gFmodRes;
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c0,
               "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/SoundFMOD.cpp"
               ,"");
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"SetAllMute","");
    FmodError::FmodError((FmodError *)local_80,&local_a0,_r,&local_c0,0x1ce,&local_e0);
    FmodError::LogErr((FmodError *)local_80);
    local_80[0] = &PTR__FmodError_002e0a18;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)((long)&((FmodError *)local_80)->sFunc + 0x10U)) {
      operator_delete(local_40._M_p,local_30._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)((long)&((FmodError *)local_80)->sFile + 0x10U)) {
      operator_delete(local_68._M_p,local_58._M_allocated_capacity + 1);
    }
    std::runtime_error::~runtime_error((runtime_error *)local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void SoundSystemFMOD::SetAllMute (bool bMute)
{
    FMOD_LOG(FMOD_ChannelGroup_SetMute(pChnGrp, bMute));
}